

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initCompilerTool(VcprojGenerator *this)

{
  VCCLCompilerTool *this_00;
  QStringList *this_01;
  QMakeProject *pQVar1;
  qsizetype qVar2;
  Data *pDVar3;
  char16_t *pcVar4;
  char cVar5;
  bool bVar6;
  int iVar7;
  ProStringList *pPVar8;
  char *ch;
  long lVar9;
  ProString *flag;
  ProString *pPVar10;
  long in_FS_OFFSET;
  QArrayDataPointer<ProString> local_d8;
  QArrayDataPointer<QString> local_b8 [2];
  ProString local_88;
  QArrayDataPointer<char16_t> local_58;
  QRegularExpressionMatch local_40 [8];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.size = -0x5555555555555556;
  local_58.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_58.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)local_b8,"OBJECTS_DIR");
  QMakeEvaluator::first(&local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
  ProString::toQString((QString *)&local_58,&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
  if (local_58.size == 0) {
    QString::operator=((QString *)&local_58,".\\");
  }
  if (0x9f < (int)(this->vcProject).Configuration.CompilerVersion) {
    (this->vcProject).Configuration.compiler.Optimization = optimizeDisabled;
  }
  QString::operator=(&(this->vcProject).Configuration.compiler.AssemblerListingLocation,
                     (QString *)&local_58);
  QString::operator=(&(this->vcProject).Configuration.compiler.ObjectFile,(QString *)&local_58);
  (this->vcProject).Configuration.compiler.ExceptionHandling = ehNone;
  if (this->usePCH == true) {
    (this->vcProject).Configuration.compiler.UsePrecompiledHeader = pchUseUsingSpecific;
    local_b8[0].ptr = &this->precompPch;
    local_b8[0].d = (Data *)0x2228aa;
    QStringBuilder<const_char_(&)[11],_QString_&>::convertTo<QString>
              (&local_88.m_string,(QStringBuilder<const_char_(&)[11],_QString_&> *)local_b8);
    pDVar3 = (this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.d;
    pcVar4 = (this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.ptr;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.d = local_88.m_string.d.d;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.ptr = local_88.m_string.d.ptr;
    qVar2 = (this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.size;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderFile.d.size = local_88.m_string.d.size
    ;
    local_88.m_string.d.d = pDVar3;
    local_88.m_string.d.ptr = pcVar4;
    local_88.m_string.d.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_b8,"PRECOMPILED_HEADER");
    QMakeEvaluator::first(&local_88,&pQVar1->super_QMakeEvaluator,(ProKey *)local_b8);
    ProString::toQString((QString *)&local_d8,&local_88);
    pDVar3 = (this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.d;
    pPVar10 = (ProString *)(this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.ptr;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.d = (Data *)local_d8.d;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.ptr =
         (char16_t *)local_d8.ptr;
    qVar2 = (this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.size;
    (this->vcProject).Configuration.compiler.PrecompiledHeaderThrough.d.size = local_d8.size;
    local_d8.d = (Data *)pDVar3;
    local_d8.ptr = pPVar10;
    local_d8.size = qVar2;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)&local_88,"PRECOMPILED_HEADER");
    pPVar8 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
    ProStringList::toQStringList((QStringList *)local_b8,pPVar8);
    QArrayDataPointer<QString>::operator=
              (&(this->vcProject).Configuration.compiler.ForcedIncludeFiles.d,local_b8);
    QArrayDataPointer<QString>::~QArrayDataPointer(local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"QMAKE_CFLAGS");
  pPVar8 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  local_d8.size = 0;
  local_d8.d = (Data *)0x0;
  local_d8.ptr = (ProString *)0x0;
  if (relevantCFlags(ProStringList_const&)::rex == '\0') {
    iVar7 = __cxa_guard_acquire(&relevantCFlags(ProStringList_const&)::rex);
    if (iVar7 != 0) {
      QString::QString((QString *)local_b8,"^[/-]std:");
      QRegularExpression::QRegularExpression
                ((QRegularExpression *)&relevantCFlags(ProStringList_const&)::rex,local_b8,0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
      __cxa_atexit(QRegularExpression::~QRegularExpression,
                   &relevantCFlags(ProStringList_const&)::rex,&__dso_handle);
      __cxa_guard_release(&relevantCFlags(ProStringList_const&)::rex);
    }
  }
  this_00 = &(this->vcProject).Configuration.compiler;
  pPVar10 = (pPVar8->super_QList<ProString>).d.ptr;
  for (lVar9 = (pPVar8->super_QList<ProString>).d.size * 0x30; lVar9 != 0; lVar9 = lVar9 + -0x30) {
    ProString::toQString((QString *)local_b8,pPVar10);
    QRegularExpression::match(local_40,&relevantCFlags(ProStringList_const&)::rex,local_b8,0,0,0);
    cVar5 = QRegularExpressionMatch::hasMatch();
    QRegularExpressionMatch::~QRegularExpressionMatch(local_40);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_b8);
    if (cVar5 != '\0') {
      QList<ProString>::emplaceBack<ProString_const&>((QList<ProString> *)&local_d8,pPVar10);
    }
    pPVar10 = pPVar10 + 1;
  }
  VCToolBase::parseOptions(&this_00->super_VCToolBase,(ProStringList *)&local_d8);
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_d8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"QMAKE_CXXFLAGS");
  pPVar8 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  VCToolBase::parseOptions(&this_00->super_VCToolBase,pPVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QString::QString(&local_88.m_string,"windows");
  bVar6 = QMakeProject::isActiveConfig(pQVar1,&local_88.m_string,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  if (bVar6) {
    ch = "_WINDOWS";
  }
  else {
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    QString::QString(&local_88.m_string,"console");
    bVar6 = QMakeProject::isActiveConfig(pQVar1,&local_88.m_string,false);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
    if (!bVar6) goto LAB_001cdba5;
    ch = "_CONSOLE";
  }
  QString::QString(&local_88.m_string,ch);
  QList<QString>::emplaceBack<QString>
            (&(this->vcProject).Configuration.compiler.PreprocessorDefinitions,&local_88.m_string);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
LAB_001cdba5:
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"DEFINES");
  pPVar8 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  ProStringList::toQStringList((QStringList *)local_b8,pPVar8);
  this_01 = &(this->vcProject).Configuration.compiler.PreprocessorDefinitions;
  QList<QString>::append(this_01,(QList<QString> *)local_b8);
  QArrayDataPointer<QString>::~QArrayDataPointer(local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"PRL_EXPORT_DEFINES");
  pPVar8 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  ProStringList::toQStringList((QStringList *)local_b8,pPVar8);
  QList<QString>::append(this_01,(QList<QString> *)local_b8);
  QArrayDataPointer<QString>::~QArrayDataPointer(local_b8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey((ProKey *)&local_88,"MSVCPROJ_INCPATH");
  pPVar8 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)&local_88);
  VCToolBase::parseOptions(&this_00->super_VCToolBase,pPVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initCompilerTool()
{
    QString placement = project->first("OBJECTS_DIR").toQString();
    if(placement.isEmpty())
        placement = ".\\";

    VCConfiguration &conf = vcProject.Configuration;
    if (conf.CompilerVersion >= NET2010) {
        // adjust compiler tool defaults for VS 2010 and above
        conf.compiler.Optimization = optimizeDisabled;
    }
    conf.compiler.AssemblerListingLocation = placement ;
    conf.compiler.ObjectFile = placement ;
    conf.compiler.ExceptionHandling = ehNone;
    // PCH
    if (usePCH) {
        conf.compiler.UsePrecompiledHeader     = pchUseUsingSpecific;
        conf.compiler.PrecompiledHeaderFile    = "$(IntDir)\\" + precompPch;
        conf.compiler.PrecompiledHeaderThrough = project->first("PRECOMPILED_HEADER").toQString();
        conf.compiler.ForcedIncludeFiles       = project->values("PRECOMPILED_HEADER").toQStringList();
    }

    conf.compiler.parseOptions(relevantCFlags(project->values("QMAKE_CFLAGS")));
    conf.compiler.parseOptions(project->values("QMAKE_CXXFLAGS"));

    if (project->isActiveConfig("windows"))
        conf.compiler.PreprocessorDefinitions += "_WINDOWS";
    else if (project->isActiveConfig("console"))
        conf.compiler.PreprocessorDefinitions += "_CONSOLE";

    conf.compiler.PreprocessorDefinitions += project->values("DEFINES").toQStringList();
    conf.compiler.PreprocessorDefinitions += project->values("PRL_EXPORT_DEFINES").toQStringList();
    conf.compiler.parseOptions(project->values("MSVCPROJ_INCPATH"));
}